

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

bool __thiscall
ON_PolyEdgeHistoryValue::ReadHelper(ON_PolyEdgeHistoryValue *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  ON_PolyEdgeHistory *this_00;
  byte local_41;
  int local_34;
  ON__INT32 local_30;
  int i;
  int count;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_PolyEdgeHistoryValue *this_local;
  
  _minor_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  ON_ClassArray<ON_PolyEdgeHistory>::Destroy(&this->m_value);
  iStack_24 = 0;
  count = 0;
  i._3_1_ = ON_BinaryArchive::BeginRead3dmChunk
                      (_minor_version,0x40008000,&stack0xffffffffffffffdc,&count);
  if ((bool)i._3_1_) {
    local_30 = 0;
    i._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&local_30);
    if ((bool)i._3_1_) {
      ON_ClassArray<ON_PolyEdgeHistory>::Reserve(&this->m_value,(long)local_30);
      local_34 = 0;
      while( true ) {
        local_41 = 0;
        if (local_34 < local_30) {
          local_41 = i._3_1_;
        }
        if ((local_41 & 1) == 0) goto LAB_007a3e67;
        this_00 = ON_ClassArray<ON_PolyEdgeHistory>::AppendNew(&this->m_value);
        bVar1 = ON_PolyEdgeHistory::Read(this_00,_minor_version);
        if (!bVar1) break;
        local_34 = local_34 + 1;
      }
      ON_ClassArray<ON_PolyEdgeHistory>::Destroy(&this->m_value);
      i._3_1_ = 0;
    }
LAB_007a3e67:
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      i._3_1_ = 0;
    }
    this_local._7_1_ = (bool)(i._3_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PolyEdgeHistoryValue::ReadHelper(ON_BinaryArchive& archive )
{
  m_value.Destroy();

  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;

  for(;;)
  {
    int count = 0;
    rc = archive.ReadInt(&count);
    if (!rc) break;
    m_value.Reserve(count);
    
    for( int i = 0; i < count && rc; i++ )
    {
      if ( !m_value.AppendNew().Read(archive) )
      {
        m_value.Destroy();
        rc = false;
        break;
      }
    }
    if (!rc) break;

    break;
  }

  if ( !archive.EndRead3dmChunk() )
    rc = false;
  return rc;
}